

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void deqp::gls::LifetimeTests::details::setupFbo(Context *ctx,GLuint seed,GLuint fbo)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Random rnd;
  deRandom local_40;
  long lVar7;
  
  iVar1 = (*ctx->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar7 + 0x78))(0x8d40,fbo);
  dVar2 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar2,"gl.bindFramebuffer(GL_FRAMEBUFFER, fbo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0xc2);
  if (seed == 0) {
    (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar7 + 0x188))(0x4000);
    dVar2 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar2,"gl.clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,199);
  }
  else {
    deRandom_init(&local_40,seed);
    dVar2 = deRandom_getUint32(&local_40);
    dVar3 = deRandom_getUint32(&local_40);
    dVar4 = deRandom_getUint32(&local_40);
    dVar5 = deRandom_getUint32(&local_40);
    fVar8 = deRandom_getFloat(&local_40);
    fVar9 = deRandom_getFloat(&local_40);
    fVar10 = deRandom_getFloat(&local_40);
    fVar11 = deRandom_getFloat(&local_40);
    fVar12 = deRandom_getFloat(&local_40);
    fVar13 = deRandom_getFloat(&local_40);
    fVar14 = deRandom_getFloat(&local_40);
    fVar15 = deRandom_getFloat(&local_40);
    (**(code **)(lVar7 + 0x1c0))(fVar8,fVar9,fVar10,fVar11);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"gl.clearColor(r1, g1, b1, a1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0xd9);
    (**(code **)(lVar7 + 0x188))(0x4000);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"gl.clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0xda);
    (**(code **)(lVar7 + 0x1290))
              ((ulong)dVar4 % (ulong)(0x81 - dVar2 % 0x81),
               (ulong)dVar5 % (ulong)(0x81 - dVar3 % 0x81),dVar2 % 0x81,dVar3 % 0x81);
    (**(code **)(lVar7 + 0x5e0))(0xc11);
    (**(code **)(lVar7 + 0x1c0))(fVar12,fVar13,fVar14,fVar15);
    (**(code **)(lVar7 + 0x188))(0x4000);
    (**(code **)(lVar7 + 0x4e8))(0xc11);
  }
  (**(code **)(lVar7 + 0x78))(0x8d40);
  dVar2 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar2,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0xe3);
  return;
}

Assistant:

void setupFbo (const Context& ctx, GLuint seed, GLuint fbo)
{
	const Functions& gl = ctx.getRenderContext().getFunctions();

	GLU_CHECK_CALL_ERROR(gl.bindFramebuffer(GL_FRAMEBUFFER, fbo),
						 gl.getError());

	if (seed == 0)
	{
		gl.clearColor(0.0, 0.0, 0.0, 1.0);
		GLU_CHECK_CALL_ERROR(gl.clear(GL_COLOR_BUFFER_BIT), gl.getError());
	}
	else
	{
		Random			rnd		(seed);
		const GLsizei	width	= rnd.getInt(0, FRAMEBUFFER_SIZE);
		const GLsizei	height	= rnd.getInt(0, FRAMEBUFFER_SIZE);
		const GLint		x		= rnd.getInt(0, FRAMEBUFFER_SIZE - width);
		const GLint		y		= rnd.getInt(0, FRAMEBUFFER_SIZE - height);
		const GLfloat	r1		= rnd.getFloat();
		const GLfloat	g1		= rnd.getFloat();
		const GLfloat	b1		= rnd.getFloat();
		const GLfloat	a1		= rnd.getFloat();
		const GLfloat	r2		= rnd.getFloat();
		const GLfloat	g2		= rnd.getFloat();
		const GLfloat	b2		= rnd.getFloat();
		const GLfloat	a2		= rnd.getFloat();

		GLU_CHECK_CALL_ERROR(gl.clearColor(r1, g1, b1, a1), gl.getError());
		GLU_CHECK_CALL_ERROR(gl.clear(GL_COLOR_BUFFER_BIT), gl.getError());
		gl.scissor(x, y, width, height);
		gl.enable(GL_SCISSOR_TEST);
		gl.clearColor(r2, g2, b2, a2);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.disable(GL_SCISSOR_TEST);
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_CHECK_ERROR(gl.getError());
}